

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

ctmbstr tidyOptGetNextMutedMessage(TidyDoc tdoc,TidyIterator *iter)

{
  uint uVar1;
  ctmbstr ptVar2;
  TidyIterator p_Var3;
  TidyDocImpl *impl;
  TidyIterator p_Var4;
  
  if (tdoc == (TidyDoc)0x0) {
    if (iter != (TidyIterator *)0x0) {
      *iter = (TidyIterator)0x0;
    }
    return (ctmbstr)0x0;
  }
  if (iter == (TidyIterator *)0x0) {
    __assert_fail("iter != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/geoffmcl[P]tidy-fork/src/message.c"
                  ,0x563,"ctmbstr prvTidygetNextMutedMessage(TidyDocImpl *, TidyIterator *)");
  }
  p_Var4 = *iter;
  uVar1 = tdoc[0xce4]._opaque;
  if (p_Var4 == (TidyIterator)0x0) {
    p_Var4 = (TidyIterator)0x0;
  }
  else if (p_Var4 <= (TidyIterator)(ulong)uVar1) {
    ptVar2 = prvTidytidyErrorCodeAsKey(*(uint *)(*(long *)(tdoc + 0xce2) + -4 + (long)p_Var4 * 4));
    p_Var4 = (TidyIterator)((long)&p_Var4->_opaque + 1);
    goto LAB_0014e918;
  }
  ptVar2 = (ctmbstr)0x0;
LAB_0014e918:
  p_Var3 = (TidyIterator)0x0;
  if (p_Var4 <= (TidyIterator)(ulong)uVar1) {
    p_Var3 = p_Var4;
  }
  *iter = p_Var3;
  return ptVar2;
}

Assistant:

ctmbstr TIDY_CALL      tidyOptGetNextMutedMessage(TidyDoc tdoc, TidyIterator* iter )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    ctmbstr result = NULL;
    if ( impl )
        result = TY_(getNextMutedMessage)( impl, iter );
    else if ( iter )
        *iter = 0;
    return result;
}